

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

uint32_t sub_word(uint32_t w,uint8_t *sbox)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint32_t i;
  long lVar7;
  byte bVar8;
  
  lVar7 = 0;
  bVar5 = 0;
  bVar8 = 0;
  bVar4 = 0;
  bVar6 = 0;
  do {
    bVar3 = (byte)lVar7;
    bVar2 = (byte)(w >> 0x18) ^ bVar3;
    bVar1 = sbox[lVar7];
    if (-1 < (char)(-bVar2 | bVar2)) {
      bVar5 = bVar1;
    }
    bVar2 = (byte)(w >> 0x10) ^ bVar3;
    if (-1 < (char)(-bVar2 | bVar2)) {
      bVar8 = bVar1;
    }
    bVar2 = (byte)(w >> 8) ^ bVar3;
    if (-1 < (char)(-bVar2 | bVar2)) {
      bVar6 = bVar1;
    }
    bVar3 = bVar3 ^ (byte)w;
    if (-1 < (char)(-bVar3 | bVar3)) {
      bVar4 = bVar1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  return (uint)bVar4 | (uint)bVar6 << 8 | (uint)bVar8 << 0x10 | (uint)bVar5 << 0x18;
}

Assistant:

static uint32_t sub_word(uint32_t w, const uint8_t *sbox)
{
  uint8_t a = byte(w, 0),
          b = byte(w, 1),
          c = byte(w, 2),
          d = byte(w, 3);
#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  select_u8x4(&a, &b, &c, &d, sbox, 256);
#else
  a = sbox[a];
  b = sbox[b];
  c = sbox[c];
  d = sbox[d];
#endif
  return word4(a, b, c, d);
}